

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

StreamingConcatenationExpressionSyntax * __thiscall
slang::parsing::Parser::parseStreamConcatenation(Parser *this,Token openBrace)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar4;
  StreamExpressionSyntax *pSVar5;
  undefined4 extraout_var;
  StreamingConcatenationExpressionSyntax *pSVar7;
  Info *pIVar8;
  Info *extraout_RDX;
  size_t extraout_RDX_00;
  TokenKind TVar9;
  undefined8 uVar10;
  BumpAllocator *dst;
  ulong uVar11;
  Token openBrace_00;
  Token TVar12;
  Token TVar13;
  Token operatorToken;
  Token local_248;
  ExpressionSyntax *local_238;
  Token local_230;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_220;
  undefined1 local_210;
  undefined8 local_208;
  undefined8 local_200;
  Info *local_1f8;
  Info *local_1f0;
  Token local_1e8;
  Token openBraceInner;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> local_1c8 [7];
  undefined8 uVar3;
  pointer pTVar6;
  
  pIVar8 = openBrace.info;
  uVar10 = openBrace._0_8_;
  TVar12 = ParserBase::consume(&this->super_ParserBase);
  uVar3 = TVar12._0_8_;
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
  local_1f0 = TVar12.info;
  if (bVar1) {
    local_238 = (ExpressionSyntax *)0x0;
  }
  else {
    local_238 = parseExpression(this);
  }
  Token::Token(&openBraceInner);
  Token::Token(&local_248);
  openBraceInner = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  if ((openBraceInner._0_4_ >> 0x10 & 1) != 0) {
    SVar4 = Token::location(&openBraceInner);
    local_248 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar4);
    pTVar6 = (pointer)0x0;
    local_1c8[0].super_SyntaxListBase.childCount = 0;
    goto LAB_00560452;
  }
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
  local_208 = uVar3;
  local_200 = uVar10;
  local_1f8 = pIVar8;
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  local_230 = TVar12;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar12.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar4 = Token::location(&local_230);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x520005,SVar4);
    }
    local_248 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
LAB_0056040d:
    pIVar8 = local_248.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar12.kind);
    if (bVar1) {
      while( true ) {
        pSVar5 = parseStreamExpression(this);
        local_220._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar5;
        local_210 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_220._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        TVar9 = TVar13.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar9);
        if (TVar9 == EndOfFile || bVar1) break;
        if (TVar9 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                              (&this->super_ParserBase,(DiagCode)0x520005,false);
            if (!bVar1) {
              local_248 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_0056040d;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_220._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_210 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_220._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        TVar9 = TVar13.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar9);
        if (TVar9 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((TVar12.info == TVar13.info && TVar12.kind == TVar9) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                              (&this->super_ParserBase,(DiagCode)0x520005,true), !bVar1)) break;
        uVar11 = TVar13._0_8_ & 0xffffffff;
        TVar12.info = TVar13.info;
        TVar12.kind = (short)uVar11;
        TVar12._2_1_ = (char)(uVar11 >> 0x10);
        TVar12.numFlags.raw = (char)(uVar11 >> 0x18);
        TVar12.rawLen = (int)(uVar11 >> 0x20);
        local_230 = TVar13;
      }
      local_248 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
      goto LAB_0056040d;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar12,CloseBrace,&local_248,(DiagCode)0x520005);
    pIVar8 = extraout_RDX;
  }
  dst = (this->super_ParserBase).alloc;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst,
                     (EVP_PKEY_CTX *)pIVar8);
  pIVar8 = local_1f8;
  uVar10 = local_200;
  uVar3 = local_208;
  pTVar6 = (pointer)CONCAT44(extraout_var,iVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst);
  local_1c8[0].super_SyntaxListBase.childCount = extraout_RDX_00;
LAB_00560452:
  local_1e8 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00b6fef8;
  openBrace_00.info = pIVar8;
  openBrace_00.kind = (short)uVar10;
  openBrace_00._2_1_ = (char)((ulong)uVar10 >> 0x10);
  openBrace_00.numFlags.raw = (char)((ulong)uVar10 >> 0x18);
  openBrace_00.rawLen = (int)((ulong)uVar10 >> 0x20);
  operatorToken.info = local_1f0;
  operatorToken.kind = (short)uVar3;
  operatorToken._2_1_ = (char)((ulong)uVar3 >> 0x10);
  operatorToken.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  operatorToken.rawLen = (int)((ulong)uVar3 >> 0x20);
  local_1c8[0].elements._M_ptr = pTVar6;
  local_1c8[0].elements._M_extent._M_extent_value = local_1c8[0].super_SyntaxListBase.childCount;
  pSVar7 = slang::syntax::SyntaxFactory::streamingConcatenationExpression
                     (&this->factory,openBrace_00,operatorToken,local_238,openBraceInner,local_1c8,
                      local_248,local_1e8);
  return pSVar7;
}

Assistant:

StreamingConcatenationExpressionSyntax& Parser::parseStreamConcatenation(Token openBrace) {
    auto op = consume();
    ExpressionSyntax* sliceSize = nullptr;
    if (!peek(TokenKind::OpenBrace))
        sliceSize = &parseExpression();

    Token openBraceInner;
    Token closeBraceInner;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleExpressionOrComma, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBraceInner, list,
        closeBraceInner, RequireItems::True, diag::ExpectedStreamExpression,
        [this] { return &parseStreamExpression(); });

    auto closeBrace = expect(TokenKind::CloseBrace);
    return factory.streamingConcatenationExpression(openBrace, op, sliceSize, openBraceInner, list,
                                                    closeBraceInner, closeBrace);
}